

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::BilinearPatch::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,BilinearPatch *this,
          ShapeSampleContext *ctx,Point2f u)

{
  ulong *puVar1;
  ulong *puVar2;
  Point3f *s;
  uint *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined8 uVar7;
  undefined4 uVar9;
  char *pcVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Float FVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar35 [64];
  undefined1 auVar37 [56];
  undefined1 auVar36 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  Point3f PVar79;
  Float quadPDF;
  Tuple2<pbrt::Point2,_float> local_180;
  float local_174;
  float local_170;
  float local_16c;
  undefined1 local_168 [16];
  optional<pbrt::ShapeSample> *local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  Tuple3<pbrt::Vector3,_float> local_118;
  Tuple3<pbrt::Vector3,_float> local_108;
  Tuple3<pbrt::Vector3,_float> local_f8;
  Tuple3<pbrt::Vector3,_float> local_e8;
  float local_dc;
  undefined1 local_d8 [16];
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_c8;
  bool local_70;
  undefined1 local_68 [16];
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  
  auVar35._8_56_ = in_register_00001208;
  auVar35._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_180 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar35._0_16_);
  auVar23 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
  local_118.z = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5;
  pcVar10 = *(char **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  auVar30._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar23._0_4_;
  auVar30._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar23._4_4_;
  auVar30._8_4_ = auVar23._8_4_ + 0.0;
  auVar30._12_4_ = auVar23._12_4_ + 0.0;
  auVar23._8_4_ = 0x3f000000;
  auVar23._0_8_ = 0x3f0000003f000000;
  auVar23._12_4_ = 0x3f000000;
  auVar22 = vmulps_avx512vl(auVar30,auVar23);
  lVar17 = *(long *)(pcVar10 + 0x10);
  lVar16 = (long)this->blpIndex * 0x10;
  lVar11 = *(long *)(pcVar10 + 0x18);
  lVar19 = (long)*(int *)(lVar17 + lVar16);
  lVar20 = (long)*(int *)(lVar17 + 4 + lVar16);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(lVar11 + lVar19 * 0xc);
  local_168._8_8_ = local_168._0_8_;
  local_168._0_8_ = lVar19 * 3;
  lVar21 = (long)*(int *)(lVar17 + 8 + lVar16);
  lVar17 = (long)*(int *)(lVar17 + 0xc + lVar16);
  auVar30 = vsubps_avx(auVar31,auVar22);
  local_e8.z = *(float *)(lVar11 + 8 + lVar19 * 0xc) - local_118.z;
  local_148._8_8_ = local_148._0_8_;
  local_148._0_8_ = lVar17 * 3;
  auVar51._0_4_ = auVar30._0_4_ * auVar30._0_4_;
  auVar51._4_4_ = auVar30._4_4_ * auVar30._4_4_;
  auVar51._8_4_ = auVar30._8_4_ * auVar30._8_4_;
  auVar51._12_4_ = auVar30._12_4_ * auVar30._12_4_;
  auVar23 = vmovshdup_avx(auVar51);
  auVar23 = vfmadd231ss_fma(auVar23,auVar30,auVar30);
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_e8.z),ZEXT416((uint)local_e8.z));
  auVar23 = vsqrtss_avx(auVar23,auVar23);
  fVar27 = auVar23._0_4_;
  auVar55._4_4_ = fVar27;
  auVar55._0_4_ = fVar27;
  auVar55._8_4_ = fVar27;
  auVar55._12_4_ = fVar27;
  local_e8.z = local_e8.z / fVar27;
  auVar23 = vdivps_avx(auVar30,auVar55);
  local_e8._0_8_ = vmovlps_avx(auVar23);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(lVar11 + lVar20 * 0xc);
  auVar30 = vsubps_avx(auVar45,auVar22);
  local_f8.z = *(float *)(lVar11 + 8 + lVar20 * 0xc) - local_118.z;
  auVar24._0_4_ = auVar30._0_4_ * auVar30._0_4_;
  auVar24._4_4_ = auVar30._4_4_ * auVar30._4_4_;
  auVar24._8_4_ = auVar30._8_4_ * auVar30._8_4_;
  auVar24._12_4_ = auVar30._12_4_ * auVar30._12_4_;
  auVar23 = vmovshdup_avx(auVar24);
  auVar23 = vfmadd231ss_fma(auVar23,auVar30,auVar30);
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_f8.z),ZEXT416((uint)local_f8.z));
  auVar23 = vsqrtss_avx(auVar23,auVar23);
  fVar27 = auVar23._0_4_;
  auVar56._4_4_ = fVar27;
  auVar56._0_4_ = fVar27;
  auVar56._8_4_ = fVar27;
  auVar56._12_4_ = fVar27;
  local_f8.z = local_f8.z / fVar27;
  auVar23 = vdivps_avx(auVar30,auVar56);
  local_f8._0_8_ = vmovlps_avx(auVar23);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(lVar11 + lVar21 * 0xc);
  auVar30 = vsubps_avx(auVar46,auVar22);
  local_108.z = *(float *)(lVar11 + 8 + lVar21 * 0xc) - local_118.z;
  auVar52._0_4_ = auVar30._0_4_ * auVar30._0_4_;
  auVar52._4_4_ = auVar30._4_4_ * auVar30._4_4_;
  auVar52._8_4_ = auVar30._8_4_ * auVar30._8_4_;
  auVar52._12_4_ = auVar30._12_4_ * auVar30._12_4_;
  auVar23 = vmovshdup_avx(auVar52);
  auVar23 = vfmadd231ss_fma(auVar23,auVar30,auVar30);
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_108.z),ZEXT416((uint)local_108.z));
  auVar23 = vsqrtss_avx(auVar23,auVar23);
  fVar27 = auVar23._0_4_;
  auVar57._4_4_ = fVar27;
  auVar57._0_4_ = fVar27;
  auVar57._8_4_ = fVar27;
  auVar57._12_4_ = fVar27;
  local_108.z = local_108.z / fVar27;
  auVar23 = vdivps_avx(auVar30,auVar57);
  local_108._0_8_ = vmovlps_avx(auVar23);
  local_118.z = *(float *)(lVar11 + 8 + lVar17 * 0xc) - local_118.z;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(lVar11 + lVar17 * 0xc);
  auVar30 = vsubps_avx(auVar42,auVar22);
  auVar22._0_4_ = auVar30._0_4_ * auVar30._0_4_;
  auVar22._4_4_ = auVar30._4_4_ * auVar30._4_4_;
  auVar22._8_4_ = auVar30._8_4_ * auVar30._8_4_;
  auVar22._12_4_ = auVar30._12_4_ * auVar30._12_4_;
  auVar23 = vmovshdup_avx(auVar22);
  auVar23 = vfmadd231ss_fma(auVar23,auVar30,auVar30);
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_118.z),ZEXT416((uint)local_118.z));
  auVar23 = vsqrtss_avx(auVar23,auVar23);
  fVar27 = auVar23._0_4_;
  auVar47._4_4_ = fVar27;
  auVar47._0_4_ = fVar27;
  auVar47._8_4_ = fVar27;
  auVar47._12_4_ = fVar27;
  local_118.z = local_118.z / fVar27;
  auVar23 = vdivps_avx(auVar30,auVar47);
  local_118._0_8_ = vmovlps_avx(auVar23);
  local_150 = __return_storage_ptr__;
  bVar15 = IsRectangle(this);
  if (((!bVar15) || (*(long *)(pcVar10 + 0x38) != 0)) ||
     (FVar26 = SphericalQuadArea((Vector3f *)&local_e8,(Vector3f *)&local_f8,(Vector3f *)&local_118,
                                 (Vector3f *)&local_108), FVar26 <= 0.0001)) {
    Sample((optional<pbrt::ShapeSample> *)&local_c8.__align,this,(Point2f)local_180);
    if (local_70 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2f54c6d);
    }
    uVar4 = *(undefined4 *)(ctx + 0x30);
    auVar14._4_4_ = local_c8._12_4_;
    auVar14._0_4_ = local_c8._8_4_;
    auVar14._8_4_ = local_c8._16_4_;
    auVar14._12_4_ = local_c8._20_4_;
    auVar23 = vinsertps_avx(auVar14,ZEXT416((uint)local_c8._20_4_),0x10);
    fVar27 = ((float)local_c8._0_4_ + (float)local_c8._4_4_) * 0.5;
    fVar28 = (*(float *)ctx + *(float *)(ctx + 4)) * 0.5;
    auVar30 = vinsertps_avx(*(undefined1 (*) [16])(ctx + 8),ZEXT416(*(uint *)(ctx + 0x14)),0x10);
    fVar40 = fVar27 - fVar28;
    auVar43._0_4_ = ((float)local_c8._12_4_ + auVar23._0_4_) * 0.5;
    auVar43._4_4_ = ((float)local_c8._16_4_ + auVar23._4_4_) * 0.5;
    auVar43._8_4_ = (auVar23._8_4_ + 0.0) * 0.5;
    auVar43._12_4_ = (auVar23._12_4_ + 0.0) * 0.5;
    auVar48._0_4_ = ((float)*(undefined8 *)(ctx + 0xc) + auVar30._0_4_) * 0.5;
    auVar48._4_4_ = ((float)((ulong)*(undefined8 *)(ctx + 0xc) >> 0x20) + auVar30._4_4_) * 0.5;
    auVar48._8_4_ = (auVar30._8_4_ + 0.0) * 0.5;
    auVar48._12_4_ = (auVar30._12_4_ + 0.0) * 0.5;
    auVar30 = vsubps_avx(auVar43,auVar48);
    auVar23 = vmovshdup_avx(auVar30);
    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ * auVar30._0_4_)),ZEXT416((uint)fVar40),
                              ZEXT416((uint)fVar40));
    auVar23 = vfmadd231ss_fma(auVar22,auVar23,auVar23);
    if ((auVar23._0_4_ != 0.0) || (NAN(auVar23._0_4_))) {
      auVar22 = vsqrtss_avx(auVar23,auVar23);
      auVar42 = vsubps_avx(auVar48,auVar43);
      auVar23 = vmovshdup_avx(auVar42);
      auVar31 = ZEXT416((uint)(fVar28 - fVar27));
      auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * auVar42._0_4_)),auVar31,auVar31);
      auVar58._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
      auVar58._8_4_ = auVar30._8_4_ ^ 0x80000000;
      auVar58._12_4_ = auVar30._12_4_ ^ 0x80000000;
      auVar30 = vfmadd231ss_fma(auVar42,auVar23,auVar23);
      auVar60._0_4_ = auVar22._0_4_;
      auVar53._0_4_ = fVar40 / auVar60._0_4_;
      auVar53._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar60._4_4_ = auVar60._0_4_;
      auVar60._8_4_ = auVar60._0_4_;
      auVar60._12_4_ = auVar60._0_4_;
      auVar23 = vdivps_avx(auVar58,auVar60);
      auVar61._4_4_ = local_c8._48_4_;
      auVar61._0_4_ = local_c8._44_4_;
      auVar61._8_8_ = 0;
      auVar67._0_4_ = auVar23._0_4_ * (float)local_c8._44_4_;
      auVar67._4_4_ = auVar23._4_4_ * (float)local_c8._48_4_;
      auVar67._8_4_ = auVar23._8_4_ * 0.0;
      auVar67._12_4_ = auVar23._12_4_ * 0.0;
      uVar18 = CONCAT44(auVar67._4_4_,auVar67._0_4_);
      auVar65._0_8_ = uVar18 ^ 0x8000000080000000;
      auVar65._8_4_ = -auVar67._8_4_;
      auVar65._12_4_ = -auVar67._12_4_;
      auVar22 = vpermi2ps_avx512vl(_DAT_004a9da0,auVar67,auVar65);
      auVar23 = vfmadd231ps_fma(auVar22,auVar61,auVar23);
      auVar23 = vhaddps_avx(auVar23,auVar23);
      auVar23 = vfnmadd231ss_fma(auVar23,auVar53,ZEXT416((uint)local_c8._40_4_));
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx512vl(auVar23,auVar13);
      fVar27 = (float)local_c8._80_4_ / (auVar23._0_4_ / auVar30._0_4_);
      if (ABS(fVar27) != INFINITY) {
        local_150->set = local_70;
        *(undefined8 *)((long)&local_150->optionalValue + 0x40) = local_c8._64_8_;
        *(anon_struct_8_0_00000001_for___align *)&local_150->optionalValue = local_c8.__align;
        *(ulong *)((long)&local_150->optionalValue + 8) = CONCAT44(local_c8._12_4_,local_c8._8_4_);
        *(ulong *)((long)&local_150->optionalValue + 0x10) =
             CONCAT44(local_c8._20_4_,local_c8._16_4_);
        *(ulong *)((long)&local_150->optionalValue + 0x18) = CONCAT44(local_c8._28_4_,uVar4);
        *(undefined8 *)((long)&local_150->optionalValue + 0x20) = local_c8._32_8_;
        *(ulong *)((long)&local_150->optionalValue + 0x28) =
             CONCAT44(local_c8._44_4_,local_c8._40_4_);
        *(ulong *)((long)&local_150->optionalValue + 0x30) =
             CONCAT44(local_c8._52_4_,local_c8._48_4_);
        *(undefined8 *)((long)&local_150->optionalValue + 0x38) = local_c8._56_8_;
        *(undefined8 *)((long)&local_150->optionalValue + 0x48) = local_c8._72_8_;
        *(float *)((long)&local_150->optionalValue + 0x50) = fVar27;
        return local_150;
      }
    }
    *(undefined8 *)((long)&local_150->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x50) = 0;
    *(undefined8 *)&local_150->set = 0;
    (local_150->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&local_150->optionalValue + 8) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&local_150->optionalValue + 0x38) = 0;
  }
  else {
    fVar27 = *(float *)(ctx + 0x24);
    fVar28 = *(float *)(ctx + 0x28);
    fVar40 = *(float *)(ctx + 0x2c);
    puVar1 = (ulong *)(lVar11 + lVar20 * 0xc);
    puVar2 = (ulong *)(lVar11 + lVar21 * 0xc);
    s = (Point3f *)(lVar11 + local_168._0_8_ * 4);
    if (((fVar27 != 0.0) || (fVar28 != 0.0)) ||
       ((NAN(fVar28) || ((fVar40 != 0.0 || (NAN(fVar40))))))) {
      auVar54._4_4_ = fVar40;
      auVar54._0_4_ = fVar40;
      auVar54._8_4_ = fVar40;
      auVar54._12_4_ = fVar40;
      auVar49._4_4_ = fVar28;
      auVar49._0_4_ = fVar28;
      auVar49._8_4_ = fVar28;
      auVar49._12_4_ = fVar28;
      auVar44._4_4_ = fVar27;
      auVar44._0_4_ = fVar27;
      auVar44._8_4_ = fVar27;
      auVar44._12_4_ = fVar27;
      auVar78._8_8_ = 0;
      auVar78._0_4_ = local_180.x;
      auVar78._4_4_ = local_180.y;
      auVar23 = vinsertps_avx(ZEXT416((uint)(s->super_Tuple3<pbrt::Point3,_float>).y),
                              ZEXT416(*(uint *)((long)puVar2 + 4)),0x10);
      auVar30 = vinsertps_avx(ZEXT416((uint)(s->super_Tuple3<pbrt::Point3,_float>).x),
                              ZEXT416((uint)*puVar2),0x10);
      auVar22 = vinsertps_avx(ZEXT416((uint)(s->super_Tuple3<pbrt::Point3,_float>).z),
                              ZEXT416((uint)puVar2[1]),0x10);
      puVar3 = (uint *)(lVar11 + local_148._0_8_ * 4);
      fVar27 = (*(float *)ctx + *(float *)(ctx + 4)) * 0.5;
      auVar66._4_4_ = fVar27;
      auVar66._0_4_ = fVar27;
      auVar66._8_4_ = fVar27;
      auVar66._12_4_ = fVar27;
      auVar31 = vsubps_avx(auVar30,auVar66);
      fVar27 = (*(float *)(ctx + 8) + *(float *)(ctx + 0xc)) * 0.5;
      auVar59._4_4_ = fVar27;
      auVar59._0_4_ = fVar27;
      auVar59._8_4_ = fVar27;
      auVar59._12_4_ = fVar27;
      auVar30 = vsubps_avx(auVar23,auVar59);
      auVar75._0_4_ = auVar30._0_4_ * auVar30._0_4_;
      auVar75._4_4_ = auVar30._4_4_ * auVar30._4_4_;
      auVar75._8_4_ = auVar30._8_4_ * auVar30._8_4_;
      auVar75._12_4_ = auVar30._12_4_ * auVar30._12_4_;
      fVar27 = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5;
      auVar45 = vfmadd231ps_fma(auVar75,auVar31,auVar31);
      auVar42 = vmovshdup_avx(auVar78);
      auVar62._4_4_ = fVar27;
      auVar62._0_4_ = fVar27;
      auVar62._8_4_ = fVar27;
      auVar62._12_4_ = fVar27;
      auVar23 = vsubps_avx(auVar22,auVar62);
      auVar22 = vfmadd231ps_fma(auVar45,auVar23,auVar23);
      auVar22 = vsqrtps_avx(auVar22);
      auVar23 = vdivps_avx(auVar23,auVar22);
      auVar30 = vdivps_avx(auVar30,auVar22);
      auVar22 = vdivps_avx(auVar31,auVar22);
      auVar76._0_4_ = auVar23._0_4_ * fVar40;
      auVar76._4_4_ = auVar23._4_4_ * fVar40;
      auVar76._8_4_ = auVar23._8_4_ * fVar40;
      auVar76._12_4_ = auVar23._12_4_ * fVar40;
      auVar30 = vfmadd213ps_fma(auVar30,auVar49,auVar76);
      auVar23 = vfmsub213ps_fma(auVar23,auVar54,auVar76);
      auVar70._0_4_ = auVar30._0_4_ + auVar23._0_4_;
      auVar70._4_4_ = auVar30._4_4_ + auVar23._4_4_;
      auVar70._8_4_ = auVar30._8_4_ + auVar23._8_4_;
      auVar70._12_4_ = auVar30._12_4_ + auVar23._12_4_;
      auVar73._8_4_ = 0x3c23d70a;
      auVar73._0_8_ = 0x3c23d70a3c23d70a;
      auVar73._12_4_ = 0x3c23d70a;
      auVar23 = vfmadd231ps_fma(auVar70,auVar44,auVar22);
      auVar68._8_4_ = 0x7fffffff;
      auVar68._0_8_ = 0x7fffffff7fffffff;
      auVar68._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx(auVar23,auVar68);
      local_168 = vmaxps_avx(auVar23,auVar73);
      auVar23 = vinsertps_avx(ZEXT416((uint)*puVar1),ZEXT416(*puVar3),0x10);
      auVar31 = vsubps_avx(auVar23,auVar66);
      auVar23 = vinsertps_avx(ZEXT416(*(uint *)((long)puVar1 + 4)),ZEXT416(puVar3[1]),0x10);
      auVar30 = vsubps_avx(auVar23,auVar59);
      auVar23 = vinsertps_avx(ZEXT416((uint)puVar1[1]),ZEXT416(puVar3[2]),0x10);
      auVar23 = vsubps_avx(auVar23,auVar62);
      auVar71._0_4_ = auVar30._0_4_ * auVar30._0_4_;
      auVar71._4_4_ = auVar30._4_4_ * auVar30._4_4_;
      auVar71._8_4_ = auVar30._8_4_ * auVar30._8_4_;
      auVar71._12_4_ = auVar30._12_4_ * auVar30._12_4_;
      auVar22 = vfmadd231ps_fma(auVar71,auVar31,auVar31);
      auVar22 = vfmadd231ps_fma(auVar22,auVar23,auVar23);
      auVar22 = vsqrtps_avx(auVar22);
      auVar23 = vdivps_avx(auVar23,auVar22);
      auVar30 = vdivps_avx(auVar30,auVar22);
      auVar22 = vdivps_avx(auVar31,auVar22);
      auVar72._0_4_ = fVar40 * auVar23._0_4_;
      auVar72._4_4_ = fVar40 * auVar23._4_4_;
      auVar72._8_4_ = fVar40 * auVar23._8_4_;
      auVar72._12_4_ = fVar40 * auVar23._12_4_;
      auVar30 = vfmadd213ps_fma(auVar30,auVar49,auVar72);
      auVar23 = vfmsub213ps_fma(auVar23,auVar54,auVar72);
      auVar50._0_4_ = auVar30._0_4_ + auVar23._0_4_;
      auVar50._4_4_ = auVar30._4_4_ + auVar23._4_4_;
      auVar50._8_4_ = auVar30._8_4_ + auVar23._8_4_;
      auVar50._12_4_ = auVar30._12_4_ + auVar23._12_4_;
      auVar23 = vfmadd231ps_fma(auVar50,auVar44,auVar22);
      auVar23 = vandps_avx(auVar68,auVar23);
      local_148 = vmaxps_avx(auVar23,auVar73);
      local_d8._0_4_ = local_168._0_4_ + local_148._0_4_;
      local_d8._4_4_ = local_168._4_4_ + local_148._4_4_;
      local_d8._8_4_ = local_168._8_4_ + local_148._8_4_;
      local_d8._12_4_ = local_168._12_4_ + local_148._12_4_;
      fVar28 = auVar42._0_4_;
      auVar23 = vmovshdup_avx(local_d8);
      fVar40 = auVar23._0_4_;
      fVar27 = fVar28 * (local_d8._0_4_ + fVar40);
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar40 * fVar40)),
                                ZEXT416((uint)(local_d8._0_4_ * local_d8._0_4_)),
                                ZEXT416((uint)(1.0 - fVar28)));
      if (auVar23._0_4_ < 0.0) {
        local_138._0_4_ = fVar27;
        local_128 = auVar78;
        fVar28 = sqrtf(auVar23._0_4_);
        fVar27 = (float)local_138._0_4_;
        auVar78 = local_128;
      }
      else {
        auVar23 = vsqrtss_avx(auVar23,auVar23);
        fVar28 = auVar23._0_4_;
      }
      auVar30 = vmovshdup_avx(local_168);
      auVar22 = vmovshdup_avx(local_148);
      fVar41 = auVar78._0_4_;
      auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(fVar27 / (local_d8._0_4_ + fVar28))));
      fVar27 = auVar23._0_4_;
      fVar28 = 1.0 - fVar27;
      auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ * fVar27)),ZEXT416((uint)fVar28),
                                local_168);
      fVar40 = auVar42._0_4_;
      auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ * fVar27)),ZEXT416((uint)fVar28),
                                local_148);
      fVar29 = auVar42._0_4_;
      fVar27 = fVar41 * (fVar40 + fVar29);
      auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar29 * fVar29)),
                                ZEXT416((uint)(fVar40 * fVar40)),ZEXT416((uint)(1.0 - fVar41)));
      if (auVar42._0_4_ < 0.0) {
        local_174 = fVar27;
        local_170 = fVar40;
        local_16c = fVar28;
        local_138 = auVar30;
        local_128 = auVar23;
        local_68 = auVar22;
        fVar29 = sqrtf(auVar42._0_4_);
        fVar28 = local_16c;
        fVar40 = local_170;
        fVar27 = local_174;
        auVar23 = local_128;
        auVar30 = local_138;
        auVar22 = local_68;
      }
      else {
        auVar42 = vsqrtss_avx(auVar42,auVar42);
        fVar29 = auVar42._0_4_;
      }
      fVar41 = 0.0;
      auVar42 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(fVar27 / (fVar40 + fVar29))));
      fVar27 = auVar42._0_4_;
      auVar42 = vinsertps_avx(auVar42,auVar23,0x10);
      local_180 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar42);
      if ((((0.0 <= fVar27) && (fVar27 <= 1.0)) && (fVar40 = auVar23._0_4_, 0.0 <= fVar40)) &&
         (fVar40 <= 1.0)) {
        fVar29 = auVar22._0_4_ + auVar30._0_4_ + local_d8._0_4_;
        if ((fVar29 != 0.0) || (fVar41 = 1.0, NAN(fVar29))) {
          auVar23 = vfmadd231ss_fma(ZEXT416((uint)(local_148._0_4_ * fVar28 * fVar27)),local_168,
                                    ZEXT416((uint)(fVar28 * (1.0 - fVar27))));
          auVar23 = vfmadd213ss_fma(auVar30,ZEXT416((uint)(fVar40 * (1.0 - fVar27))),auVar23);
          auVar23 = vfmadd213ss_fma(auVar22,ZEXT416((uint)(fVar40 * fVar27)),auVar23);
          fVar41 = (auVar23._0_4_ * 4.0) / fVar29;
        }
      }
    }
    else {
      fVar41 = 1.0;
    }
    local_168._0_4_ = fVar41;
    auVar23 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
    auVar32._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar23._0_4_;
    auVar32._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar23._4_4_;
    auVar32._8_4_ = auVar23._8_4_ + 0.0;
    auVar32._12_4_ = auVar23._12_4_ + 0.0;
    auVar12._8_4_ = 0x3f000000;
    auVar12._0_8_ = 0x3f0000003f000000;
    auVar12._12_4_ = 0x3f000000;
    auVar23 = vmulps_avx512vl(auVar32,auVar12);
    local_c8._8_4_ = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5;
    local_c8.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar23);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *puVar1;
    uVar5 = (s->super_Tuple3<pbrt::Point3,_float>).x;
    uVar8 = (s->super_Tuple3<pbrt::Point3,_float>).y;
    auVar38._4_4_ = uVar8;
    auVar38._0_4_ = uVar5;
    auVar38._8_8_ = 0;
    local_50.z = (s->super_Tuple3<pbrt::Point3,_float>).z;
    auVar23 = vsubps_avx(auVar33,auVar38);
    local_40.z = *(float *)(puVar1 + 1) - local_50.z;
    local_40._0_8_ = vmovlps_avx(auVar23);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *puVar2;
    auVar23 = vsubps_avx(auVar34,auVar38);
    auVar37 = ZEXT856(auVar23._8_8_);
    local_50._0_8_ = vmovlps_avx(auVar23);
    local_50.z = *(float *)(puVar2 + 1) - local_50.z;
    PVar79 = SampleSphericalRectangle
                       ((Point3f *)&local_c8.__align,s,(Vector3f *)&local_40,(Vector3f *)&local_50,
                        (Point2f *)&local_180,&local_dc);
    auVar39._0_4_ = PVar79.super_Tuple3<pbrt::Point3,_float>.z;
    auVar36._0_8_ = PVar79.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar36._8_56_ = auVar37;
    fVar27 = (s->super_Tuple3<pbrt::Point3,_float>).z;
    uVar4 = *(undefined4 *)(ctx + 0x30);
    auVar22 = auVar36._0_16_;
    auVar30 = vshufps_avx(auVar22,auVar22,0x50);
    fVar28 = *(float *)(puVar2 + 1);
    fVar40 = *(float *)((long)puVar1 + 4);
    bVar15 = *pcVar10 == pcVar10[1];
    auVar23 = vinsertps_avx(ZEXT416((uint)puVar1[1]),ZEXT416((uint)*puVar1),0x10);
    local_150->set = true;
    *(undefined1 (*) [16])&local_150->optionalValue = auVar30;
    auVar39._4_4_ = auVar39._0_4_;
    auVar39._8_4_ = auVar39._0_4_;
    auVar39._12_4_ = auVar39._0_4_;
    fVar28 = fVar28 - fVar27;
    uVar18 = 0xff;
    if (!bVar15) {
      uVar18 = 0;
    }
    uVar7 = vmovlps_avx(auVar39);
    *(undefined8 *)((long)&local_150->optionalValue + 0x10) = uVar7;
    *(undefined4 *)((long)&local_150->optionalValue + 0x18) = uVar4;
    *(undefined8 *)((long)&local_150->optionalValue + 0x1c) = 0;
    *(undefined4 *)((long)&local_150->optionalValue + 0x24) = 0;
    uVar6 = (s->super_Tuple3<pbrt::Point3,_float>).x;
    uVar9 = (s->super_Tuple3<pbrt::Point3,_float>).y;
    auVar74._4_4_ = uVar9;
    auVar74._0_4_ = uVar6;
    auVar74._8_8_ = 0;
    auVar30 = vmovshdup_avx(auVar74);
    auVar42 = vsubps_avx(auVar22,auVar74);
    fVar40 = fVar40 - auVar30._0_4_;
    auVar30 = vinsertps_avx(ZEXT416((uint)fVar27),auVar74,0x1c);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = *puVar2;
    auVar31 = vsubps_avx(auVar23,auVar30);
    auVar45 = vsubps_avx(auVar63,auVar74);
    auVar30 = vmovshdup_avx(auVar42);
    auVar23 = vmovshdup_avx(auVar45);
    auVar24 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar45,ZEXT416((uint)fVar28));
    fVar29 = auVar23._0_4_;
    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ * fVar29)),auVar45,auVar42);
    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),auVar45,auVar45);
    auVar47 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar28),ZEXT416((uint)(auVar39._0_4_ - fVar27)))
    ;
    auVar22 = ZEXT416((uint)fVar28);
    auVar46 = vfmadd231ss_fma(auVar46,auVar22,auVar22);
    auVar52 = ZEXT416((uint)(auVar31._0_4_ * fVar29));
    auVar51 = vfmsub213ss_fma(auVar22,ZEXT416((uint)fVar40),auVar52);
    auVar23 = vfnmadd231ss_fma(auVar52,auVar31,auVar23);
    auVar22 = vmovshdup_avx(auVar31);
    fVar28 = auVar23._0_4_ + auVar51._0_4_;
    auVar23 = vinsertps_avx(auVar22,ZEXT416((uint)fVar40),0x10);
    auVar77._0_4_ = auVar23._0_4_ * auVar24._0_4_;
    auVar77._4_4_ = auVar23._4_4_ * auVar24._4_4_;
    auVar77._8_4_ = auVar23._8_4_ * auVar24._8_4_;
    auVar77._12_4_ = auVar23._12_4_ * auVar24._12_4_;
    auVar45 = vfmsub213ps_fma(auVar45,auVar31,auVar77);
    auVar23 = vfnmadd213ps_fma(auVar24,auVar23,auVar77);
    auVar64._0_4_ = auVar23._0_4_ + auVar45._0_4_;
    auVar64._4_4_ = auVar23._4_4_ + auVar45._4_4_;
    auVar64._8_4_ = auVar23._8_4_ + auVar45._8_4_;
    auVar64._12_4_ = auVar23._12_4_ + auVar45._12_4_;
    auVar23 = vmovshdup_avx(auVar64);
    auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar64._0_4_)),ZEXT416((uint)fVar28),
                              ZEXT416((uint)fVar28));
    auVar23 = vfmadd213ss_fma(auVar23,auVar23,auVar45);
    auVar23 = vsqrtss_avx(auVar23,auVar23);
    auVar69._0_4_ = auVar23._0_4_;
    auVar69._4_4_ = auVar69._0_4_;
    auVar69._8_4_ = auVar69._0_4_;
    auVar69._12_4_ = auVar69._0_4_;
    auVar23 = vdivps_avx(auVar64,auVar69);
    *(uint *)((long)&local_150->optionalValue + 0x28) =
         (uint)bVar15 * (int)(fVar28 / auVar69._0_4_) +
         (uint)!bVar15 * (int)-(fVar28 / auVar69._0_4_);
    bVar15 = (bool)((byte)uVar18 & 1);
    auVar25._0_4_ = (uint)bVar15 * auVar23._0_4_ | (uint)!bVar15 * (auVar23._0_4_ ^ 0x80000000);
    bVar15 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar25._4_4_ = (uint)bVar15 * auVar23._4_4_ | (uint)!bVar15 * (auVar23._4_4_ ^ 0x80000000);
    bVar15 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar25._8_4_ = (uint)bVar15 * auVar23._8_4_ | (uint)!bVar15 * (auVar23._8_4_ ^ 0x80000000);
    bVar15 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar25._12_4_ = (uint)bVar15 * auVar23._12_4_ | (uint)!bVar15 * (auVar23._12_4_ ^ 0x80000000);
    uVar7 = vmovlps_avx(auVar25);
    *(undefined8 *)((long)&local_150->optionalValue + 0x2c) = uVar7;
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ * fVar40)),auVar42,auVar22);
    auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40)),auVar22,auVar22);
    auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)(auVar39._0_4_ - fVar27)),auVar31);
    auVar30 = vfmadd231ss_fma(auVar30,auVar31,auVar31);
    *(ulong *)((long)&local_150->optionalValue + 0x34) =
         CONCAT44(auVar47._0_4_ / auVar46._0_4_,auVar23._0_4_ / auVar30._0_4_);
    *(undefined1 (*) [16])((long)&local_150->optionalValue + 0x40) = ZEXT416(0) << 0x20;
    *(float *)((long)&local_150->optionalValue + 0x50) = (float)local_168._0_4_ * local_dc;
  }
  return local_150;
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(const ShapeSampleContext &ctx,
                                                  Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle() && !mesh->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Sample direction to rectanglular bilinear patch
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Warp uniform sample _u_ to account for incident $\cos \theta$ factor
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            u = SampleBilinear(u, w);
            pdf *= BilinearPDF(u, w);
        }
        // Sample spherical rectangle at reference point $\pt{}$
        Float quadPDF;
        Point3f p =
            SampleSphericalRectangle(ctx.p(), p00, p10 - p00, p01 - p00, u, &quadPDF);
        pdf *= quadPDF;

        // Compute surface normal and $(u,v)$ for sampled point on rectangle
        Normal3f n = Normal3f(Normalize(Cross(p10 - p00, p01 - p00)));
        if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;
        Point2f uv(Dot(p - p00, p10 - p00) / DistanceSquared(p10, p00),
                   Dot(p - p00, p01 - p00) / DistanceSquared(p01, p00));

        return ShapeSample{Interaction(p, n, ctx.time, uv), pdf};

    } else {
        // Uniformly sample shape and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert uniform area sample PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }
}